

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O1

void __thiscall
HTTP::HTTP(HTTP *this,string *host,unsigned_short port,string *path,IPAddress *outgoing)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  IPAddress IVar4;
  long *plVar5;
  Client *pCVar6;
  long *plVar7;
  string request;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->response)._M_dataplus._M_p = (pointer)&(this->response).field_2;
  (this->response)._M_string_length = 0;
  (this->response).field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  this->status = 0;
  this->done = false;
  std::operator+(&local_70,"GET ",path);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_c0 = *plVar7;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(host->_M_dataplus)._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = (Client *)operator_new(0xa0);
  Client::Client(pCVar6);
  this->client = pCVar6;
  if (outgoing->address != 0) {
    pCVar6 = this->client;
    iVar2 = rand();
    uVar3 = rand();
    Client::Bind(pCVar6,outgoing,
                 (uint16_t)
                 (int)((double)(uVar3 & 0xffff | iVar2 << 0x10) * 2.3283064365386963e-10 * 16384.0 +
                      49152.0));
  }
  Client::SetSendBuffer(this->client,0x2000);
  Client::SetRecvBuffer(this->client,0x2000);
  pCVar6 = this->client;
  pcVar1 = (host->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + host->_M_string_length);
  IVar4 = IPAddress::Lookup(&local_90);
  local_50 = (long *)CONCAT44(local_50._4_4_,IVar4.address);
  Client::Connect(pCVar6,(IPAddress *)&local_50,port);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  this->done = false;
  Client::Send(this->client,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

HTTP::HTTP(std::string host, unsigned short port, std::string path, const IPAddress & outgoing)
{
	std::string request;

	this->status = 0;
	this->done = false;

	request = "GET " + path + " HTTP/1.1\r\n"
	"Host: " + host + "\r\n"
	"User-Agent: EOSERV\r\n"
	"Accept: */*\r\n"
	"Accept-Encoding: \r\n"
	"Connection: close\r\n"
	"\r\n";

	client = new Client;

	if (static_cast<unsigned int>(outgoing) != 0)
	{
		int retry = 0;

		while (true)
		{
			try
			{
				client->Bind(outgoing, util::rand(49152, 65535));
				break;
			}
			catch (Socket_BindFailed &e)
			{
				if (++retry >= 10)
					throw;
			}
		}
	}

	client->SetSendBuffer(8192);
	client->SetRecvBuffer(8192);

	client->Connect(IPAddress::Lookup(host), port);

	this->done = false;

	client->Send(request);
}